

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableFilter.cpp
# Opt level: O2

void __thiscall
Ptex::v2_2::PtexSeparableFilter::apply
          (PtexSeparableFilter *this,PtexSeparableKernel *k,int faceid,FaceInfo *f)

{
  uint uVar1;
  int iVar2;
  DataType DVar3;
  _func_int *p_Var4;
  bool bVar5;
  PtexPtr<Ptex::v2_2::PtexFaceData> PVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  float *pfVar12;
  long lVar13;
  PtexSeparableKernel *pPVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  bool bVar18;
  float fVar19;
  undefined8 uStack_f0;
  PtexSeparableKernel local_e8;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  PtexPtr<Ptex::v2_2::PtexFaceData> local_58;
  PtexPtr<Ptex::v2_2::PtexFaceData> th;
  PtexPtr<Ptex::v2_2::PtexFaceData> dh;
  float *local_40;
  PtexFaceData *pPVar11;
  
  if (k->uw < 1) {
    return;
  }
  if (k->vw < 1) {
    return;
  }
  while (1 << ((f->res).ulog2 & 0x1fU) < 1 << ((k->res).ulog2 & 0x1fU)) {
    uStack_f0 = 0x3b7d86;
    PtexSeparableKernel::downresU(k);
  }
  while (1 << ((f->res).vlog2 & 0x1fU) < 1 << ((k->res).vlog2 & 0x1fU)) {
    uStack_f0 = 0x3b7d90;
    PtexSeparableKernel::downresV(k);
  }
  uStack_f0 = 0x3b7dbe;
  iVar7 = (*this->_tx->_vptr_PtexTexture[0x14])(this->_tx,(ulong)(uint)faceid,(ulong)*(uint *)k);
  th._ptr = (PtexFaceData *)CONCAT44(extraout_var,iVar7);
  pPVar14 = &local_e8;
  if (th._ptr == (PtexFaceData *)0x0) goto LAB_003b811b;
  uStack_f0 = 0x3b7dd4;
  iVar7 = (*(th._ptr)->_vptr_PtexFaceData[3])(th._ptr);
  if ((char)iVar7 != '\0') {
    pfVar12 = this->_result;
    uStack_f0 = 0x3b7dea;
    iVar7 = (*(th._ptr)->_vptr_PtexFaceData[6])();
    uStack_f0 = 0x3b7e0a;
    PtexSeparableKernel::applyConst
              (k,pfVar12,(void *)(CONCAT44(extraout_var_00,iVar7) + (long)this->_firstChanOffset),
               this->_dt,this->_nchan);
    pPVar14 = &local_e8;
    goto LAB_003b811b;
  }
  uVar1 = this->_nchan;
  bVar18 = this->_efm != efm_tanvec;
  bVar5 = k->rot < 1;
  if ((bVar5 || (int)uVar1 < 2) || bVar18) {
    local_40 = this->_result;
    pPVar14 = &local_e8;
  }
  else {
    lVar13 = -((ulong)uVar1 * 4 + 0xf & 0xfffffffffffffff0);
    local_40 = (float *)((long)&local_e8 + lVar13);
    *(undefined8 *)((long)&local_e8 + lVar13 + -8) = 0x3b7e57;
    memset(local_40,0,(ulong)uVar1 << 2);
    pPVar14 = (PtexSeparableKernel *)local_40;
  }
  p_Var4 = (th._ptr)->_vptr_PtexFaceData[7];
  *(float *)((long)pPVar14 + -8) = 5.463644e-39;
  *(float *)((long)pPVar14 + -4) = 0.0;
  iVar7 = (*p_Var4)();
  if ((char)iVar7 == '\0') {
    p_Var4 = (th._ptr)->_vptr_PtexFaceData[6];
    *(float *)((long)pPVar14 + -8) = 5.464251e-39;
    *(float *)((long)pPVar14 + -4) = 0.0;
    iVar15 = (*p_Var4)();
    iVar7 = this->_firstChanOffset;
    DVar3 = this->_dt;
    iVar17 = this->_nchan;
    iVar16 = this->_ntxchan;
    *(float *)((long)pPVar14 + -8) = 5.464303e-39;
    *(float *)((long)pPVar14 + -4) = 0.0;
    PtexSeparableKernel::apply
              (k,local_40,(void *)(CONCAT44(extraout_var_04,iVar15) + (long)iVar7),DVar3,iVar17,
               iVar16);
  }
  else {
    p_Var4 = (th._ptr)->_vptr_PtexFaceData[8];
    *(float *)((long)pPVar14 + -8) = 5.463674e-39;
    *(float *)((long)pPVar14 + -4) = 0.0;
    iVar7 = (*p_Var4)();
    local_e8.uw = 0;
    local_e8.u = 0;
    local_e8.v = 0;
    local_e8.rot = 0;
    local_e8.kubuff[0] = 0.0;
    local_e8.kvbuff[0] = 0.0;
    iVar16 = 1 << ((byte)iVar7 & 0x1f);
    local_e8.res = SUB42(iVar7,0);
    local_60 = 1 << ((byte)((uint)iVar7 >> 8) & 0x1f);
    local_5c = (1 << ((k->res).ulog2 & 0x1fU)) / iVar16;
    iVar7 = k->v;
    iVar17 = k->vw;
    while (0 < iVar17) {
      local_e8.v = iVar7 % local_60;
      local_e8.vw = local_60 - iVar7 % local_60;
      local_64 = iVar17;
      if (iVar17 < local_e8.vw) {
        local_e8.vw = iVar17;
      }
      local_68 = iVar7;
      local_e8.kv = k->kv + ((long)iVar7 - (long)k->v);
      iVar17 = k->u;
      iVar15 = (iVar7 / local_60) * local_5c;
      for (iVar7 = k->uw; PVar6._ptr = th._ptr, 0 < iVar7; iVar7 = iVar7 - local_e8.uw) {
        local_e8.u = iVar17 % iVar16;
        local_e8.uw = iVar16 - iVar17 % iVar16;
        if (iVar7 < local_e8.uw) {
          local_e8.uw = iVar7;
        }
        local_e8.ku = k->ku + ((long)iVar17 - (long)k->u);
        p_Var4 = (th._ptr)->_vptr_PtexFaceData[9];
        *(float *)((long)pPVar14 + -8) = 5.464019e-39;
        *(float *)((long)pPVar14 + -4) = 0.0;
        iVar8 = (*p_Var4)(PVar6._ptr,(ulong)(uint)(iVar17 / iVar16 + iVar15));
        pPVar11 = (PtexFaceData *)CONCAT44(extraout_var_01,iVar8);
        local_58._ptr = pPVar11;
        if (pPVar11 != (PtexFaceData *)0x0) {
          p_Var4 = pPVar11->_vptr_PtexFaceData[3];
          *(float *)((long)pPVar14 + -8) = 5.464044e-39;
          *(float *)((long)pPVar14 + -4) = 0.0;
          iVar8 = (*p_Var4)(pPVar11);
          p_Var4 = (local_58._ptr)->_vptr_PtexFaceData[6];
          if ((char)iVar8 == '\0') {
            *(float *)((long)pPVar14 + -8) = 5.464125e-39;
            *(float *)((long)pPVar14 + -4) = 0.0;
            iVar10 = (*p_Var4)();
            iVar8 = this->_firstChanOffset;
            DVar3 = this->_dt;
            iVar2 = this->_nchan;
            iVar9 = this->_ntxchan;
            *(float *)((long)pPVar14 + -8) = 5.464183e-39;
            *(float *)((long)pPVar14 + -4) = 0.0;
            PtexSeparableKernel::apply
                      (&local_e8,local_40,(void *)(CONCAT44(extraout_var_03,iVar10) + (long)iVar8),
                       DVar3,iVar2,iVar9);
          }
          else {
            *(float *)((long)pPVar14 + -8) = 5.464068e-39;
            *(float *)((long)pPVar14 + -4) = 0.0;
            iVar9 = (*p_Var4)();
            iVar8 = this->_firstChanOffset;
            iVar2 = this->_nchan;
            DVar3 = this->_dt;
            *(float *)((long)pPVar14 + -8) = 5.46412e-39;
            *(float *)((long)pPVar14 + -4) = 0.0;
            PtexSeparableKernel::applyConst
                      (&local_e8,local_40,(void *)(CONCAT44(extraout_var_02,iVar9) + (long)iVar8),
                       DVar3,iVar2);
          }
        }
        *(float *)((long)pPVar14 + -8) = 5.464195e-39;
        *(float *)((long)pPVar14 + -4) = 0.0;
        PtexPtr<Ptex::v2_2::PtexFaceData>::~PtexPtr(&local_58);
        iVar17 = iVar17 + local_e8.uw;
      }
      iVar7 = local_68 + local_e8.vw;
      iVar17 = local_64 - local_e8.vw;
    }
  }
  if ((bVar5 || (int)uVar1 < 2) || bVar18) goto LAB_003b811b;
  switch(k->rot) {
  case 0:
    pfVar12 = this->_result;
    *pfVar12 = *local_40 + *pfVar12;
    fVar19 = local_40[1];
    goto LAB_003b80e9;
  case 1:
    pfVar12 = this->_result;
    *pfVar12 = *pfVar12 - local_40[1];
    fVar19 = *local_40;
LAB_003b80e9:
    fVar19 = fVar19 + pfVar12[1];
LAB_003b80ee:
    pfVar12[1] = fVar19;
    break;
  case 2:
    pfVar12 = this->_result;
    *pfVar12 = *pfVar12 - *local_40;
    pfVar12[1] = pfVar12[1] - local_40[1];
    break;
  case 3:
    pfVar12 = this->_result;
    *pfVar12 = local_40[1] + *pfVar12;
    fVar19 = pfVar12[1] - *local_40;
    goto LAB_003b80ee;
  }
  iVar7 = this->_nchan;
  pfVar12 = this->_result;
  *(float *)((long)pPVar14 + -8) = 2.8026e-45;
  *(float *)((long)pPVar14 + -4) = 0.0;
  for (lVar13 = *(long *)((long)pPVar14 + -8); lVar13 < iVar7; lVar13 = lVar13 + 1) {
    pfVar12[lVar13] = local_40[lVar13] + pfVar12[lVar13];
  }
LAB_003b811b:
  *(undefined8 *)((long)pPVar14 + -8) = 0x3b8124;
  PtexPtr<Ptex::v2_2::PtexFaceData>::~PtexPtr(&th);
  return;
}

Assistant:

void PtexSeparableFilter::apply(PtexSeparableKernel& k, int faceid, const Ptex::FaceInfo& f)
{
    assert(k.u >= 0 && k.u + k.uw <= k.res.u());
    assert(k.v >= 0 && k.v + k.vw <= k.res.v());

    if (k.uw <= 0 || k.vw <= 0) return;

    // downres kernel if needed
    while (k.res.u() > f.res.u()) k.downresU();
    while (k.res.v() > f.res.v()) k.downresV();

    // get face data, and apply
    PtexPtr<PtexFaceData> dh ( _tx->getData(faceid, k.res) );
    if (!dh) return;

    if (dh->isConstant()) {
        k.applyConst(_result, (char*)dh->getData()+_firstChanOffset, _dt, _nchan);
        return;
    }

    // allocate temporary result for tanvec mode (if needed)
    bool tanvecMode = (_efm == efm_tanvec) && (_nchan >= 2) && (k.rot > 0);
    float* result = tanvecMode ? (float*) alloca(sizeof(float)*_nchan) : _result;
    if (tanvecMode) memset(result, 0, sizeof(float)*_nchan);

    if (dh->isTiled()) {
        Ptex::Res tileres = dh->tileRes();
        PtexSeparableKernel kt;
        kt.res = tileres;
        int tileresu = tileres.u();
        int tileresv = tileres.v();
        int ntilesu = k.res.u() / tileresu;
        for (int v = k.v, vw = k.vw; vw > 0; vw -= kt.vw, v += kt.vw) {
            int tilev = v / tileresv;
            kt.v = v % tileresv;
            kt.vw = PtexUtils::min(vw, tileresv - kt.v);
            kt.kv = k.kv + v - k.v;
            for (int u = k.u, uw = k.uw; uw > 0; uw -= kt.uw, u += kt.uw) {
                int tileu = u / tileresu;
                kt.u = u % tileresu;
                kt.uw = PtexUtils::min(uw, tileresu - kt.u);
                kt.ku = k.ku + u - k.u;
                PtexPtr<PtexFaceData> th ( dh->getTile(tilev * ntilesu + tileu) );
                if (th) {
                    if (th->isConstant())
                        kt.applyConst(result, (char*)th->getData()+_firstChanOffset, _dt, _nchan);
                    else
                        kt.apply(result, (char*)th->getData()+_firstChanOffset, _dt, _nchan, _ntxchan);
                }
            }
        }
    }
    else {
        k.apply(result, (char*)dh->getData()+_firstChanOffset, _dt, _nchan, _ntxchan);
    }

    if (tanvecMode) {
        // rotate tangent-space vector data and update main result
        switch (k.rot) {
            case 0: // rot==0 included for completeness, but tanvecMode should be false in this case
                _result[0] += result[0];
                _result[1] += result[1];
                break;
            case 1:
                _result[0] -= result[1];
                _result[1] += result[0];
                break;
            case 2:
                _result[0] -= result[0];
                _result[1] -= result[1];
                break;
            case 3:
                _result[0] += result[1];
                _result[1] -= result[0];
                break;
        }
        for (int i = 2; i < _nchan; i++) _result[i] += result[i];
    }
}